

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

void __thiscall Fl_Table::row_position(Fl_Table *this,int row)

{
  long lVar1;
  int iVar2;
  int row_00;
  double v;
  
  if ((this->_row_position != row) && (this->tih < this->table_h)) {
    iVar2 = this->_rows + -1;
    if (row < this->_rows) {
      iVar2 = row;
    }
    row_00 = 0;
    if (-1 < row) {
      row_00 = iVar2;
    }
    lVar1 = row_scroll_position(this,row_00);
    v = (this->vscrollbar->super_Fl_Slider).super_Fl_Valuator.max;
    if ((double)lVar1 <= v) {
      v = (double)lVar1;
    }
    Fl_Valuator::value((Fl_Valuator *)this->vscrollbar,v);
    table_scrolled(this);
    Fl_Widget::redraw((Fl_Widget *)this);
    this->_row_position = row_00;
  }
  return;
}

Assistant:

void Fl_Table::row_position(int row) {
  if ( _row_position == row ) return;		// OPTIMIZATION: no change? avoid redraw
  if ( row < 0 ) row = 0;
  else if ( row >= rows() ) row = rows() - 1;
  if ( table_h <= tih ) return;			// don't scroll if table smaller than window
  double newtop = row_scroll_position(row);
  if ( newtop > vscrollbar->maximum() ) {
    newtop = vscrollbar->maximum();
  }
  vscrollbar->Fl_Slider::value(newtop);
  table_scrolled();
  redraw();
  _row_position = row;	// HACK: override what table_scrolled() came up with
}